

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Value * __thiscall
wabt::interp::Instance::ResolveInitExpr
          (Value *__return_storage_ptr__,Instance *this,Store *store,InitExpr init)

{
  undefined4 val;
  Global *this_00;
  reference pvVar1;
  anon_union_16_6_113bff37_for_Value_0 local_60;
  Enum local_50;
  size_t local_48;
  undefined1 local_40 [8];
  Ptr global;
  Store *store_local;
  Instance *this_local;
  
  Value::Value(__return_storage_ptr__);
  val = init.field_1.i32_;
  switch(init.kind) {
  case None:
    abort();
  case I32:
    Value::Set<unsigned_int>(__return_storage_ptr__,val);
    break;
  case I64:
    Value::Set<unsigned_long>(__return_storage_ptr__,init.field_1.i64_);
    break;
  case F32:
    Value::Set<float>(__return_storage_ptr__,(f32)val);
    break;
  case F64:
    Value::Set<double>(__return_storage_ptr__,init.field_1.f64_);
    break;
  case V128:
    global.root_index_ = init.field_1.i64_;
    Value::Set<v128>(__return_storage_ptr__,init.field_1.v128_.v);
    break;
  case GlobalGet:
    pvVar1 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->globals_,(ulong)(uint)val);
    local_48 = pvVar1->index;
    RefPtr<wabt::interp::Global>::RefPtr
              ((RefPtr<wabt::interp::Global> *)local_40,store,(Ref)local_48);
    this_00 = RefPtr<wabt::interp::Global>::operator->((RefPtr<wabt::interp::Global> *)local_40);
    Global::Get((Value *)&local_60.v128_,this_00);
    (__return_storage_ptr__->field_0).i64_ = local_60.i64_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = local_60._8_8_;
    (__return_storage_ptr__->type).enum_ = local_50;
    RefPtr<wabt::interp::Global>::~RefPtr((RefPtr<wabt::interp::Global> *)local_40);
    break;
  case RefNull:
    Value::Set<wabt::interp::Ref>(__return_storage_ptr__,Ref::Null);
    break;
  case RefFunc:
    pvVar1 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->funcs_,(ulong)(uint)val);
    Value::Set<wabt::interp::Ref>(__return_storage_ptr__,(Ref)pvVar1->index);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Instance::ResolveInitExpr(Store& store, InitExpr init) {
  Value result;
  switch (init.kind) {
    case InitExprKind::I32:      result.Set(init.i32_); break;
    case InitExprKind::I64:      result.Set(init.i64_); break;
    case InitExprKind::F32:      result.Set(init.f32_); break;
    case InitExprKind::F64:      result.Set(init.f64_); break;
    case InitExprKind::V128:     result.Set(init.v128_); break;
    case InitExprKind::GlobalGet: {
      Global::Ptr global{store, globals_[init.index_]};
      result = global->Get();
      break;
    }
    case InitExprKind::RefFunc: {
      result.Set(funcs_[init.index_]);
      break;
    }
    case InitExprKind::RefNull:
      result.Set(Ref::Null);
      break;

    case InitExprKind::None:
      WABT_UNREACHABLE;
  }
  return result;
}